

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O2

QRectF * qvariant_cast<QRectF>(QRectF *__return_storage_ptr__,QVariant *v)

{
  PrivateShared *pPVar1;
  ulong uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  qreal qVar7;
  bool bVar8;
  long in_FS_OFFSET;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QRectF>::metaType;
  local_28.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(v->d).field_0x18 & 0xfffffffffffffffc);
  bVar8 = comparesEqual(&local_28,&local_20);
  if (bVar8) {
    if (((v->d).field_0x18 & 1) != 0) {
      pPVar1 = (v->d).data.shared;
      v = (QVariant *)
          ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                  super___atomic_base<int> + (long)pPVar1->offset);
    }
    uVar3 = *(undefined4 *)&(v->d).data;
    uVar4 = *(undefined4 *)((long)&(v->d).data + 4);
    uVar5 = *(undefined4 *)((long)&(v->d).data + 8);
    uVar6 = *(undefined4 *)((long)&(v->d).data + 0xc);
    qVar7 = *(qreal *)&(v->d).field_0x18;
    __return_storage_ptr__->w = *(qreal *)((long)&(v->d).data + 0x10);
    __return_storage_ptr__->h = qVar7;
    *(undefined4 *)&__return_storage_ptr__->xp = uVar3;
    *(undefined4 *)((long)&__return_storage_ptr__->xp + 4) = uVar4;
    *(undefined4 *)&__return_storage_ptr__->yp = uVar5;
    *(undefined4 *)((long)&__return_storage_ptr__->yp + 4) = uVar6;
  }
  else {
    __return_storage_ptr__->w = 0.0;
    __return_storage_ptr__->h = 0.0;
    __return_storage_ptr__->xp = 0.0;
    __return_storage_ptr__->yp = 0.0;
    uVar2 = *(ulong *)&(v->d).field_0x18;
    if ((uVar2 & 1) != 0) {
      pPVar1 = (v->d).data.shared;
      v = (QVariant *)
          ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                  super___atomic_base<int> + (long)pPVar1->offset);
    }
    QMetaType::convert((QMetaTypeInterface *)(uVar2 & 0xfffffffffffffffc),v,local_20,
                       __return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}